

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

void __thiscall QToolBarAreaLayoutLine::fitLayout(QToolBarAreaLayoutLine *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  qsizetype qVar5;
  reference pQVar6;
  QToolBarLayout *pQVar7;
  QList<QToolBarAreaLayoutItem> *this_00;
  long in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem *item_1;
  int i_1;
  int pos;
  int extraSpace;
  int itemMin;
  QToolBarLayout *tblayout;
  QToolBarAreaLayoutItem *item;
  int i;
  int space;
  int min;
  int last;
  int extra;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  QToolBarAreaLayoutItem *in_stack_ffffffffffffff40;
  Orientation o;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int local_80;
  int local_7c;
  int local_60;
  int local_54;
  int local_40 [3];
  QSize local_34;
  QSize local_2c;
  int local_24 [3];
  QSize local_18;
  QSize local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = -1;
  uVar8 = *(undefined4 *)(in_RDI + 0x10);
  local_10 = minimumSize((QToolBarAreaLayoutLine *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  iVar3 = pick((Orientation)((ulong)in_stack_ffffffffffffff40 >> 0x20),
               (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_18 = QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  local_24[0] = pick((Orientation)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                     (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_24[1] = 0;
  local_24[0] = local_24[0] - iVar3;
  piVar4 = qMax<int>(local_24 + 1,local_24);
  local_24[2] = *piVar4;
  for (local_60 = 0;
      qVar5 = QList<QToolBarAreaLayoutItem>::size((QList<QToolBarAreaLayoutItem> *)(in_RDI + 0x18)),
      local_60 < qVar5; local_60 = local_60 + 1) {
    pQVar6 = QList<QToolBarAreaLayoutItem>::operator[]
                       ((QList<QToolBarAreaLayoutItem> *)in_stack_ffffffffffffff40,
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    bVar2 = QToolBarAreaLayoutItem::skip
                      ((QToolBarAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar2) {
      (*pQVar6->widgetItem->_vptr_QLayoutItem[0xd])();
      QWidget::layout((QWidget *)0x6f0405);
      pQVar7 = qobject_cast<QToolBarLayout*>((QObject *)0x6f040d);
      if (pQVar7 != (QToolBarLayout *)0x0) {
        QToolBarLayout::checkUsePopupMenu
                  ((QToolBarLayout *)CONCAT44(uVar8,in_stack_ffffffffffffff60));
      }
      in_stack_ffffffffffffff54 = *(undefined4 *)(in_RDI + 0x10);
      local_2c = QToolBarAreaLayoutItem::minimumSize(in_stack_ffffffffffffff40);
      iVar3 = pick((Orientation)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (pQVar6->preferredSize < 1) {
        in_stack_ffffffffffffff4c = *(undefined4 *)(in_RDI + 0x10);
        local_34 = QToolBarAreaLayoutItem::sizeHint(in_stack_ffffffffffffff40);
        in_stack_ffffffffffffff50 =
             pick((Orientation)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                  (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      else {
        in_stack_ffffffffffffff50 = pQVar6->preferredSize;
      }
      pQVar6->size = in_stack_ffffffffffffff50;
      local_40[2] = pQVar6->size - iVar3;
      piVar4 = qMin<int>(local_40 + 2,local_24 + 2);
      iVar1 = *piVar4;
      pQVar6->size = iVar3 + iVar1;
      local_24[2] = local_24[2] - iVar1;
      local_54 = local_60;
    }
  }
  local_7c = 0;
  local_80 = 0;
  while( true ) {
    this_00 = (QList<QToolBarAreaLayoutItem> *)(long)local_80;
    qVar5 = QList<QToolBarAreaLayoutItem>::size((QList<QToolBarAreaLayoutItem> *)(in_RDI + 0x18));
    if (qVar5 <= (long)this_00) break;
    pQVar6 = QList<QToolBarAreaLayoutItem>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    o = (Orientation)((ulong)this_00 >> 0x20);
    bVar2 = QToolBarAreaLayoutItem::skip
                      ((QToolBarAreaLayoutItem *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (!bVar2) {
      pQVar6->pos = local_7c;
      if (local_80 == local_54) {
        local_40[1] = 0;
        in_stack_ffffffffffffff3c = *(undefined4 *)(in_RDI + 0x10);
        QRect::size((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        local_40[0] = pick(o,(QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
        ;
        local_40[0] = local_40[0] - pQVar6->pos;
        piVar4 = qMax<int>(local_40 + 1,local_40);
        pQVar6->size = *piVar4;
      }
      local_7c = pQVar6->size + local_7c;
    }
    local_80 = local_80 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBarAreaLayoutLine::fitLayout()
{
    int last = -1;
    int min = pick(o, minimumSize());
    int space = pick(o, rect.size());
    int extra = qMax(0, space - min);

    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        if (QToolBarLayout *tblayout = qobject_cast<QToolBarLayout*>(item.widgetItem->widget()->layout()))
            tblayout->checkUsePopupMenu();

        const int itemMin = pick(o, item.minimumSize());
        //preferredSize is the default if it is set, otherwise, we take the sizehint
        item.size = item.preferredSize > 0 ? item.preferredSize : pick(o, item.sizeHint());

        //the extraspace is the space above the item minimum sizehint
        const int extraSpace = qMin(item.size - itemMin, extra);
        item.size = itemMin + extraSpace; //that is the real size

        extra -= extraSpace;

        last = i;
    }

    // calculate the positions from the sizes
    int pos = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        item.pos = pos;
        if (i == last) // stretch the last item to the end of the line
            item.size = qMax(0, pick(o, rect.size()) - item.pos);
        pos += item.size;
    }
}